

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O0

void __thiscall
cnn::ShadowLookupParameters::ShadowLookupParameters
          (ShadowLookupParameters *this,LookupParameters *lp)

{
  bool bVar1;
  reference pTVar2;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_RDI;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *unaff_retaddr;
  Tensor *t;
  iterator __end1;
  iterator __begin1;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__range1;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  __normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
  local_20 [3];
  
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(unaff_retaddr,in_RDI);
  local_20[0]._M_current =
       (Tensor *)
       std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (__normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
             ::operator*(local_20);
    in_stack_ffffffffffffffb4 =
         Dim::size((Dim *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    in_stack_ffffffffffffffa8 =
         (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
         cnn_mm_malloc((size_t)unaff_retaddr,(size_t)in_RDI);
    pTVar2->v = (float *)in_stack_ffffffffffffffa8;
    TensorTools::Zero((Tensor *)0x6b94f5);
    __gnu_cxx::
    __normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>::
    operator++(local_20);
  }
  return;
}

Assistant:

ShadowLookupParameters::ShadowLookupParameters(const LookupParameters& lp) : h(lp.values) {
  for (auto& t : h) {
    t.v = (float*)cnn_mm_malloc(t.d.size() * sizeof(float), 256);
    TensorTools::Zero(t);
  }
}